

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_entry.cc
# Opt level: O1

int raptor_list_remove_entry(list_entry *item)

{
  list_entry *plVar1;
  list_entry *plVar2;
  
  plVar1 = item->next;
  if (plVar1 != item) {
    plVar2 = item->prev;
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    return 1;
  }
  return 0;
}

Assistant:

int raptor_list_remove_entry(list_entry* item) {
    if (item->next == item) {  // item is list head, it's empty.
        return 0;
    }

    list_entry* prior = item->prev;
    list_entry* next = item->next;

    prior->next = next;
    next->prev = prior;
    return 1;
}